

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall
ON_SubDMeshFragment::GetFaceFragments
          (ON_SubDMeshFragment *this,ON_SubDMeshFragment **fragments,size_t fragments_capacity)

{
  ushort uVar1;
  uint uVar2;
  ON_SubDMeshFragment *pOVar3;
  ulong uVar4;
  
  uVar1 = this->m_face_fragment_count;
  uVar2 = 0;
  if ((uint)uVar1 + (uint)(uVar1 == 0) <= fragments_capacity) {
    pOVar3 = FirstFaceFragment(this);
    uVar4 = 0;
    for (; (uVar4 < uVar1 && (pOVar3 != (ON_SubDMeshFragment *)0x0));
        pOVar3 = pOVar3->m_next_fragment) {
      fragments[uVar4] = pOVar3;
      uVar4 = uVar4 + 1;
    }
    uVar2 = 0;
    if (uVar1 <= uVar4) {
      uVar2 = (uint)uVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragment::FaceFragmentCount() const
{
  return m_face_fragment_count;
}